

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::QuadrantRendederCase::initPrograms
          (QuadrantRendederCase *this,SourceCollections *programCollection)

{
  GLSLVersion GVar1;
  bool bVar2;
  uint uVar3;
  ProgramSources *pPVar4;
  char *pcVar5;
  ostream *poVar6;
  ostream *poVar7;
  GLSLVersion GVar8;
  char **value;
  char **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar9;
  allocator<char> local_371;
  string local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [40];
  string local_2a8;
  char *nextStageName;
  string local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  string local_1c8;
  ostringstream buf;
  
  uVar3 = this->m_exitingStages;
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"vertex",&local_371);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_268);
    GVar8 = this->m_exitingStages;
    if ((GVar8 & GLSL_VERSION_310_ES) == GLSL_VERSION_100_ES) {
      pcVar9 = "mediump";
      if ((GVar8 & GLSL_VERSION_400) == GLSL_VERSION_100_ES) {
        nextStageName = (char *)0x0;
        GVar1 = GVar8 & 0x10;
        GVar8 = 0x9d6f43;
        if (GVar1 != GLSL_VERSION_100_ES) {
          nextStageName = "frag";
        }
      }
      else {
        nextStageName = "geo";
      }
    }
    else {
      nextStageName = "tsc";
      pcVar9 = "highp";
    }
    pcVar5 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    uVar3 = this->m_activeStages;
    if ((uVar3 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&buf,pcVar5);
      poVar6 = std::operator<<(poVar6,"\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,1);
      poVar6 = std::operator<<(poVar6,(string *)&local_370);
      poVar6 = std::operator<<(poVar6,"layout(location = 1) flat out highp int ");
      poVar6 = std::operator<<(poVar6,nextStageName);
      poVar6 = std::operator<<(poVar6,"_quadrant_id;\n");
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_350,(_anonymous_namespace_ *)0x1,this->m_glslVersion,GVar8);
      poVar6 = std::operator<<(poVar6,(string *)&local_350);
      poVar6 = std::operator<<(poVar6,"void main (void)\n");
      poVar6 = std::operator<<(poVar6,"{\n");
      poVar6 = std::operator<<(poVar6,"\thighp vec4 result_position;\n");
      poVar6 = std::operator<<(poVar6,"\thighp int quadrant_id;\n");
      poVar6 = std::operator<<(poVar6,
                               "\thighp int quadPhase = gl_VertexIndex % 6;\n\thighp int quadXcoord = int(quadPhase == 1 || quadPhase == 4 || quadPhase == 5);\n\thighp int quadYcoord = int(quadPhase == 2 || quadPhase == 3 || quadPhase == 5);\n\thighp int quadOriginX = (gl_VertexIndex / 6) % 2;\n\thighp int quadOriginY = (gl_VertexIndex / 6) / 2;\n\tquadrant_id = gl_VertexIndex / 6;\n\tresult_position = vec4(float(quadOriginX + quadXcoord - 1), float(quadOriginY + quadYcoord - 1), 0.0, 1.0);\n"
                              );
      poVar6 = std::operator<<(poVar6,"\tgl_Position = result_position;\n");
      poVar6 = std::operator<<(poVar6,"\t");
      poVar6 = std::operator<<(poVar6,nextStageName);
      poVar6 = std::operator<<(poVar6,"_quadrant_id = quadrant_id;\n");
      std::operator<<(poVar6,"}\n");
    }
    else {
      poVar6 = std::operator<<((ostream *)&buf,pcVar5);
      poVar6 = std::operator<<(poVar6,"\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,1);
      poVar6 = std::operator<<(poVar6,(string *)&local_370);
      GVar8 = GLSL_VERSION_100_ES;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,1);
      poVar6 = std::operator<<(poVar6,(string *)&local_350);
      poVar6 = std::operator<<(poVar6,"layout(location = 0) out ");
      poVar6 = std::operator<<(poVar6,pcVar9);
      poVar6 = std::operator<<(poVar6," vec4 ");
      poVar6 = std::operator<<(poVar6,nextStageName);
      poVar6 = std::operator<<(poVar6,"_color;\n");
      if (uVar3 == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,"",(allocator<char> *)&local_208);
      }
      else {
        de::toString<char_const*>(&local_1c8,(de *)&nextStageName,value);
        std::operator+(&local_208,"layout(location = 1) flat out highp int ",&local_1c8);
        std::operator+(&local_330,&local_208,"_quadrant_id;\n");
      }
      poVar6 = std::operator<<(poVar6,(string *)&local_330);
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_310,(_anonymous_namespace_ *)0x1,this->m_glslVersion,GVar8);
      poVar6 = std::operator<<(poVar6,(string *)&local_310);
      poVar6 = std::operator<<(poVar6,"void main (void)\n");
      poVar6 = std::operator<<(poVar6,"{\n");
      poVar6 = std::operator<<(poVar6,"\thighp vec4 result_position;\n");
      poVar6 = std::operator<<(poVar6,"\thighp int quadrant_id;\n");
      poVar6 = std::operator<<(poVar6,
                               "\thighp int quadPhase = gl_VertexIndex % 6;\n\thighp int quadXcoord = int(quadPhase == 1 || quadPhase == 4 || quadPhase == 5);\n\thighp int quadYcoord = int(quadPhase == 2 || quadPhase == 3 || quadPhase == 5);\n\thighp int quadOriginX = (gl_VertexIndex / 6) % 2;\n\thighp int quadOriginY = (gl_VertexIndex / 6) / 2;\n\tquadrant_id = gl_VertexIndex / 6;\n\tresult_position = vec4(float(quadOriginX + quadXcoord - 1), float(quadOriginY + quadYcoord - 1), 0.0, 1.0);\n"
                              );
      poVar6 = std::operator<<(poVar6,"\tgl_Position = result_position;\n");
      if (uVar3 == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"",(allocator<char> *)&local_228);
      }
      else {
        de::toString<char_const*>(&local_1e8,(de *)&nextStageName,value_00);
        std::operator+(&local_228,"\t",&local_1e8);
        std::operator+(&local_2f0,&local_228,"_quadrant_id = quadrant_id;\n");
      }
      poVar6 = std::operator<<(poVar6,(string *)&local_2f0);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\thighp vec4 result_color;\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_2a8,this,1);
      poVar6 = std::operator<<(poVar6,(string *)&local_2a8);
      poVar6 = std::operator<<(poVar6,"\t");
      poVar6 = std::operator<<(poVar6,nextStageName);
      poVar6 = std::operator<<(poVar6,"_color = result_color;\n");
      std::operator<<(poVar6,"}\n");
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2f0);
      if (uVar3 == 1) {
        std::__cxx11::string::~string((string *)&local_310);
        this_00 = &local_330;
      }
      else {
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_208);
        this_00 = &local_1c8;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::VertexSource::VertexSource((VertexSource *)local_2d0,&local_248);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2d0);
    std::__cxx11::string::~string((string *)(local_2d0 + 8));
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 2) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"tess_ctrl",(allocator<char> *)&local_268);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_2f0);
    pcVar9 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    bVar2 = glu::glslVersionIsES(this->m_glslVersion);
    pcVar5 = "#extension GL_EXT_tessellation_shader : require\n";
    GVar8 = 0x95f203;
    if (2 < (int)this->m_glslVersion) {
      pcVar5 = "";
    }
    if (!bVar2) {
      pcVar5 = "";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    if ((this->m_activeStages & 2) == 0) {
      if ((this->m_activeStages & 4) != 0) {
        poVar6 = std::operator<<((ostream *)&buf,pcVar9);
        poVar6 = std::operator<<(poVar6,"\n");
        poVar6 = std::operator<<(poVar6,pcVar5);
        poVar6 = std::operator<<(poVar6,"layout(vertices=3) out;\n");
        poVar6 = std::operator<<(poVar6,
                                 "layout(location = 1) flat in highp int tsc_quadrant_id[];\n");
        poVar6 = std::operator<<(poVar6,
                                 "layout(location = 1) flat out highp int tes_quadrant_id[];\n");
        BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                  (&local_370,(_anonymous_namespace_ *)0x2,this->m_glslVersion,GVar8);
        poVar6 = std::operator<<(poVar6,(string *)&local_370);
        poVar6 = std::operator<<(poVar6,"void main (void)\n");
        poVar6 = std::operator<<(poVar6,"{\n");
        poVar6 = std::operator<<(poVar6,"\ttes_quadrant_id[gl_InvocationID] = tsc_quadrant_id[0];\n"
                                );
        poVar6 = std::operator<<(poVar6,"\n");
        poVar6 = std::operator<<(poVar6,"\t// no dynamic input block indexing\n");
        poVar6 = std::operator<<(poVar6,"\thighp vec4 position;\n");
        poVar6 = std::operator<<(poVar6,"\tif (gl_InvocationID == 0)\n");
        poVar6 = std::operator<<(poVar6,"\t\tposition = gl_in[0].gl_Position;\n");
        poVar6 = std::operator<<(poVar6,"\telse if (gl_InvocationID == 1)\n");
        poVar6 = std::operator<<(poVar6,"\t\tposition = gl_in[1].gl_Position;\n");
        poVar6 = std::operator<<(poVar6,"\telse\n");
        poVar6 = std::operator<<(poVar6,"\t\tposition = gl_in[2].gl_Position;\n");
        poVar6 = std::operator<<(poVar6,"\tgl_out[gl_InvocationID].gl_Position = position;\n");
        poVar6 = std::operator<<(poVar6,"\tgl_TessLevelInner[0] = 2.8;\n");
        poVar6 = std::operator<<(poVar6,"\tgl_TessLevelInner[1] = 2.8;\n");
        poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[0] = 2.8;\n");
        poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[1] = 2.8;\n");
        poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[2] = 2.8;\n");
        poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[3] = 2.8;\n");
        std::operator<<(poVar6,"}\n");
        goto LAB_00557f8c;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&buf,pcVar9);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,pcVar5);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,2);
      poVar6 = std::operator<<(poVar6,(string *)&local_370);
      poVar6 = std::operator<<(poVar6,"layout(vertices=3) out;\n");
      GVar8 = GLSL_VERSION_100_ES;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,2);
      poVar6 = std::operator<<(poVar6,(string *)&local_350);
      poVar6 = std::operator<<(poVar6,"layout(location = 1) flat in highp int tsc_quadrant_id[];\n")
      ;
      poVar6 = std::operator<<(poVar6,"layout(location = 0) out highp vec4 tes_color[];\n");
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)0x2,this->m_glslVersion,GVar8);
      poVar6 = std::operator<<(poVar6,(string *)&local_330);
      poVar6 = std::operator<<(poVar6,"void main (void)\n");
      poVar6 = std::operator<<(poVar6,"{\n");
      poVar6 = std::operator<<(poVar6,"\thighp vec4 result_color;\n");
      poVar6 = std::operator<<(poVar6,
                               "\thighp int quadrant_id = tsc_quadrant_id[gl_InvocationID];\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this,2);
      poVar6 = std::operator<<(poVar6,(string *)&local_310);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\ttes_color[gl_InvocationID] = result_color;\n");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\t// no dynamic input block indexing\n");
      poVar6 = std::operator<<(poVar6,"\thighp vec4 position;\n");
      poVar6 = std::operator<<(poVar6,"\tif (gl_InvocationID == 0)\n");
      poVar6 = std::operator<<(poVar6,"\t\tposition = gl_in[0].gl_Position;\n");
      poVar6 = std::operator<<(poVar6,"\telse if (gl_InvocationID == 1)\n");
      poVar6 = std::operator<<(poVar6,"\t\tposition = gl_in[1].gl_Position;\n");
      poVar6 = std::operator<<(poVar6,"\telse\n");
      poVar6 = std::operator<<(poVar6,"\t\tposition = gl_in[2].gl_Position;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_out[gl_InvocationID].gl_Position = position;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_TessLevelInner[0] = 2.8;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_TessLevelInner[1] = 2.8;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[0] = 2.8;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[1] = 2.8;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[2] = 2.8;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_TessLevelOuter[3] = 2.8;\n");
      std::operator<<(poVar6,"}\n");
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
LAB_00557f8c:
      std::__cxx11::string::~string((string *)&local_370);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_2d0,&local_2a8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2d0);
    std::__cxx11::string::~string((string *)(local_2d0 + 8));
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2f0);
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 4) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"tess_eval",(allocator<char> *)&local_268);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_2f0);
    pcVar9 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    bVar2 = glu::glslVersionIsES(this->m_glslVersion);
    pcVar5 = "#extension GL_EXT_tessellation_shader : require\n";
    GVar8 = 0x95f203;
    if (2 < (int)this->m_glslVersion) {
      pcVar5 = "";
    }
    if (!bVar2) {
      pcVar5 = "";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    if ((this->m_activeStages & 4) == 0) {
      if ((this->m_activeStages & 2) != 0) {
        poVar6 = std::operator<<((ostream *)&buf,pcVar9);
        poVar6 = std::operator<<(poVar6,"\n");
        poVar6 = std::operator<<(poVar6,pcVar5);
        poVar6 = std::operator<<(poVar6,"layout(triangles) in;\n");
        poVar6 = std::operator<<(poVar6,"layout(location = 0) in highp vec4 tes_color[];\n");
        poVar6 = std::operator<<(poVar6,"layout(location = 0) out mediump vec4 frag_color;\n");
        BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                  (&local_370,(_anonymous_namespace_ *)0x4,this->m_glslVersion,GVar8);
        poVar6 = std::operator<<(poVar6,(string *)&local_370);
        poVar6 = std::operator<<(poVar6,"void main (void)\n");
        poVar6 = std::operator<<(poVar6,"{\n");
        poVar6 = std::operator<<(poVar6,"\tfrag_color = tes_color[0];\n");
        poVar6 = std::operator<<(poVar6,
                                 "\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
                                );
        std::operator<<(poVar6,"}\n");
        goto LAB_005582c6;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&buf,pcVar9);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,pcVar5);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,4);
      poVar6 = std::operator<<(poVar6,(string *)&local_370);
      poVar6 = std::operator<<(poVar6,"layout(triangles) in;\n");
      GVar8 = GLSL_VERSION_100_ES;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,4);
      poVar6 = std::operator<<(poVar6,(string *)&local_350);
      poVar6 = std::operator<<(poVar6,"layout(location = 1) flat in highp int tes_quadrant_id[];\n")
      ;
      poVar6 = std::operator<<(poVar6,"layout(location = 0) out mediump vec4 frag_color;\n");
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)0x4,this->m_glslVersion,GVar8);
      poVar6 = std::operator<<(poVar6,(string *)&local_330);
      poVar6 = std::operator<<(poVar6,"void main (void)\n");
      poVar6 = std::operator<<(poVar6,"{\n");
      poVar6 = std::operator<<(poVar6,"\thighp vec4 result_color;\n");
      poVar6 = std::operator<<(poVar6,"\thighp int quadrant_id = tes_quadrant_id[0];\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this,4);
      poVar6 = std::operator<<(poVar6,(string *)&local_310);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\tfrag_color = result_color;\n");
      poVar6 = std::operator<<(poVar6,
                               "\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
                              );
      std::operator<<(poVar6,"}\n");
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
LAB_005582c6:
      std::__cxx11::string::~string((string *)&local_370);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_2d0,&local_2a8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2d0);
    std::__cxx11::string::~string((string *)(local_2d0 + 8));
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2f0);
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 8) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"geometry",&local_371);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_248);
    pcVar9 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    bVar2 = glu::glslVersionIsES(this->m_glslVersion);
    pcVar5 = "#extension GL_EXT_geometry_shader : require\n";
    if (2 < (int)this->m_glslVersion) {
      pcVar5 = "";
    }
    if (!bVar2) {
      pcVar5 = "";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    if ((this->m_activeStages & 8) != 0) {
      poVar6 = std::operator<<((ostream *)&buf,pcVar9);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,pcVar5);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,8);
      poVar6 = std::operator<<(poVar6,(string *)&local_370);
      poVar6 = std::operator<<(poVar6,"layout(triangles) in;\n");
      poVar6 = std::operator<<(poVar6,"layout(triangle_strip, max_vertices=4) out;\n");
      GVar8 = GLSL_VERSION_100_ES;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_350,this,8);
      poVar6 = std::operator<<(poVar6,(string *)&local_350);
      poVar6 = std::operator<<(poVar6,"layout(location = 1) flat in highp int geo_quadrant_id[];\n")
      ;
      poVar6 = std::operator<<(poVar6,"layout(location = 0) out mediump vec4 frag_color;\n");
      BindingModel::(anonymous_namespace)::genPerVertexBlock_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)0x8,this->m_glslVersion,GVar8);
      poVar6 = std::operator<<(poVar6,(string *)&local_330);
      poVar6 = std::operator<<(poVar6,"void main (void)\n");
      poVar6 = std::operator<<(poVar6,"{\n");
      poVar6 = std::operator<<(poVar6,"\thighp int quadrant_id;\n");
      poVar6 = std::operator<<(poVar6,"\thighp vec4 result_color;\n");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\tquadrant_id = geo_quadrant_id[0];\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_310,this,8);
      poVar6 = std::operator<<(poVar6,(string *)&local_310);
      poVar6 = std::operator<<(poVar6,"\tfrag_color = result_color;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_Position = gl_in[0].gl_Position;\n");
      poVar6 = std::operator<<(poVar6,"\tEmitVertex();\n");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\tquadrant_id = geo_quadrant_id[1];\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_2f0,this,8);
      poVar6 = std::operator<<(poVar6,(string *)&local_2f0);
      poVar6 = std::operator<<(poVar6,"\tfrag_color = result_color;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_Position = gl_in[1].gl_Position;\n");
      poVar6 = std::operator<<(poVar6,"\tEmitVertex();\n");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\tquadrant_id = geo_quadrant_id[2];\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_2a8,this,8);
      poVar6 = std::operator<<(poVar6,(string *)&local_2a8);
      poVar6 = std::operator<<(poVar6,"\tfrag_color = result_color;\n");
      poVar6 = std::operator<<(poVar6,
                               "\tgl_Position = gl_in[0].gl_Position * 0.5 + gl_in[2].gl_Position * 0.5;\n"
                              );
      poVar6 = std::operator<<(poVar6,"\tEmitVertex();\n");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\tquadrant_id = geo_quadrant_id[0];\n");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_268,this,8);
      poVar6 = std::operator<<(poVar6,(string *)&local_268);
      poVar6 = std::operator<<(poVar6,"\tfrag_color = result_color;\n");
      poVar6 = std::operator<<(poVar6,"\tgl_Position = gl_in[2].gl_Position;\n");
      poVar6 = std::operator<<(poVar6,"\tEmitVertex();\n");
      std::operator<<(poVar6,"}\n");
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::GeometrySource::GeometrySource((GeometrySource *)local_2d0,(string *)&nextStageName);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2d0);
    std::__cxx11::string::~string((string *)(local_2d0 + 8));
    std::__cxx11::string::~string((string *)&nextStageName);
    std::__cxx11::string::~string((string *)&local_248);
    uVar3 = this->m_exitingStages;
  }
  if ((uVar3 & 0x10) == 0) goto LAB_005589bd;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"fragment",(allocator<char> *)&local_2f0);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_330);
  pcVar9 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  if ((this->m_activeStages & 0x10) == 0) {
    if (this->m_activeStages != 0) {
      poVar6 = std::operator<<((ostream *)&buf,pcVar9);
      poVar6 = std::operator<<(poVar6,"\n");
      pcVar9 = 
      "layout(location = 0) in mediump vec4 frag_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = frag_color;\n}\n"
      ;
      goto LAB_00558950;
    }
    poVar6 = std::operator<<((ostream *)&buf,pcVar9);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"layout(location = 1) flat in highp int frag_quadrant_id;\n");
    poVar6 = std::operator<<(poVar6,"layout(location = 0) out mediump vec4 o_color;\n");
    poVar6 = std::operator<<(poVar6,"void main (void)\n");
    poVar6 = std::operator<<(poVar6,"{\n");
    poVar6 = std::operator<<(poVar6,"\thighp int quadrant_id = frag_quadrant_id;\n");
    poVar6 = std::operator<<(poVar6,"\thighp vec4 result_color;\n");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])(&local_370,this);
    poVar6 = std::operator<<(poVar6,(string *)&local_370);
    poVar6 = std::operator<<(poVar6,"\to_color = result_color;\n");
    std::operator<<(poVar6,"}\n");
    std::__cxx11::string::~string((string *)&local_370);
  }
  else {
    poVar6 = std::operator<<((ostream *)&buf,pcVar9);
    poVar6 = std::operator<<(poVar6,"\n");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,8);
    poVar6 = std::operator<<(poVar6,(string *)&local_370);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (&local_350,this,0x10,0);
    std::operator<<(poVar6,(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    if (this->m_activeStages != 0x10) {
      std::operator<<((ostream *)&buf,"layout(location = 0) in mediump vec4 frag_color;\n");
    }
    poVar6 = (ostream *)&buf;
    poVar7 = std::operator<<(poVar6,"layout(location = 1) flat in highp int frag_quadrant_id;\n");
    poVar7 = std::operator<<(poVar7,"layout(location = 0) out mediump vec4 o_color;\n");
    poVar7 = std::operator<<(poVar7,"void main (void)\n");
    poVar7 = std::operator<<(poVar7,"{\n");
    poVar7 = std::operator<<(poVar7,"\thighp int quadrant_id = frag_quadrant_id;\n");
    poVar7 = std::operator<<(poVar7,"\thighp vec4 result_color;\n");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_370,this,0x10);
    std::operator<<(poVar7,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    if (this->m_activeStages == 0x10) {
      pcVar9 = "\to_color = result_color;\n";
      poVar7 = poVar6;
    }
    else {
      poVar7 = std::operator<<((ostream *)&buf,"\tif (frag_quadrant_id < 2)\n");
      poVar7 = std::operator<<(poVar7,"\t\to_color = result_color;\n");
      poVar7 = std::operator<<(poVar7,"\telse\n");
      pcVar9 = "\t\to_color = frag_color;\n";
    }
    std::operator<<(poVar7,pcVar9);
    pcVar9 = "}\n";
LAB_00558950:
    std::operator<<(poVar6,pcVar9);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2d0,&local_310);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2d0);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  uVar3 = this->m_exitingStages;
LAB_005589bd:
  if ((uVar3 & 0x20) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"compute",(allocator<char> *)&local_2a8);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_310);
    pcVar9 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    poVar6 = std::operator<<((ostream *)&buf,pcVar9);
    poVar6 = std::operator<<(poVar6,"\n");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_370,this,0x20);
    poVar6 = std::operator<<(poVar6,(string *)&local_370);
    poVar6 = std::operator<<(poVar6,
                             "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (&local_350,this,0x20,1);
    poVar6 = std::operator<<(poVar6,(string *)&local_350);
    poVar6 = std::operator<<(poVar6,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n"
                            );
    poVar6 = std::operator<<(poVar6,"{\n");
    poVar6 = std::operator<<(poVar6,"\thighp vec4 read_colors[4];\n");
    poVar6 = std::operator<<(poVar6,"} b_out;\n");
    poVar6 = std::operator<<(poVar6,"void main (void)\n");
    poVar6 = std::operator<<(poVar6,"{\n");
    poVar6 = std::operator<<(poVar6,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n");
    poVar6 = std::operator<<(poVar6,"\thighp vec4 result_color;\n");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_330,this,0x20);
    poVar6 = std::operator<<(poVar6,(string *)&local_330);
    poVar6 = std::operator<<(poVar6,"\tb_out.read_colors[gl_WorkGroupID.x] = result_color;\n");
    std::operator<<(poVar6,"}\n");
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_2d0,&local_2f0);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2d0);
    std::__cxx11::string::~string((string *)(local_2d0 + 8));
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
  }
  return;
}

Assistant:

void QuadrantRendederCase::initPrograms (vk::SourceCollections& programCollection) const
{
	if ((m_exitingStages & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0u)
		programCollection.glslSources.add("vertex") << glu::VertexSource(genVertexSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0u)
		programCollection.glslSources.add("tess_ctrl") << glu::TessellationControlSource(genTessCtrlSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0u)
		programCollection.glslSources.add("tess_eval") << glu::TessellationEvaluationSource(genTessEvalSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0u)
		programCollection.glslSources.add("geometry") << glu::GeometrySource(genGeometrySource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0u)
		programCollection.glslSources.add("fragment") << glu::FragmentSource(genFragmentSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_COMPUTE_BIT) != 0u)
		programCollection.glslSources.add("compute") << glu::ComputeSource(genComputeSource());
}